

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  double dVar9;
  int state;
  char *name;
  Slot *slot;
  int mods_local;
  int action_local;
  int scancode_local;
  int key_local;
  GLFWwindow *window_local;
  
  pvVar4 = glfwGetWindowUserPointer(window);
  pcVar5 = glfwGetKeyName(key,scancode);
  uVar2 = counter;
  if (pcVar5 == (char *)0x0) {
    counter = counter + 1;
    uVar1 = *(uint *)((long)pvVar4 + 8);
    dVar9 = glfwGetTime();
    pcVar5 = get_key_name(key);
    pcVar6 = get_mods_name(mods);
    pcVar7 = get_action_name(action);
    printf("%08x to %i at %0.3f: Key 0x%04x Scancode 0x%04x (%s) (with%s) was %s\n",dVar9,
           (ulong)uVar2,(ulong)uVar1,(ulong)(uint)key,(ulong)(uint)scancode,pcVar5,pcVar6,pcVar7);
  }
  else {
    counter = counter + 1;
    uVar1 = *(uint *)((long)pvVar4 + 8);
    dVar9 = glfwGetTime();
    pcVar6 = get_key_name(key);
    pcVar7 = get_mods_name(mods);
    pcVar8 = get_action_name(action);
    printf("%08x to %i at %0.3f: Key 0x%04x Scancode 0x%04x (%s) (%s) (with%s) was %s\n",dVar9,
           (ulong)uVar2,(ulong)uVar1,(ulong)(uint)key,(ulong)(uint)scancode,pcVar6,pcVar5,pcVar7,
           pcVar8);
  }
  if (action == 1) {
    if (key == 0x43) {
      *(uint *)((long)pvVar4 + 0xc) = (uint)((*(int *)((long)pvVar4 + 0xc) != 0 ^ 0xffU) & 1);
      pcVar5 = "disabled";
      if (*(int *)((long)pvVar4 + 0xc) != 0) {
        pcVar5 = "enabled";
      }
      printf("(( closing %s ))\n",pcVar5);
    }
    else if (key == 0x4c) {
      iVar3 = glfwGetInputMode(window,0x33004);
      glfwSetInputMode(window,0x33004,(uint)((iVar3 != 0 ^ 0xffU) & 1));
      pcVar5 = "disabled";
      if (iVar3 == 0) {
        pcVar5 = "enabled";
      }
      printf("(( lock key mods %s ))\n",pcVar5);
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    Slot* slot = glfwGetWindowUserPointer(window);
    const char* name = glfwGetKeyName(key, scancode);

    if (name)
    {
        printf("%08x to %i at %0.3f: Key 0x%04x Scancode 0x%04x (%s) (%s) (with%s) was %s\n",
               counter++, slot->number, glfwGetTime(), key, scancode,
               get_key_name(key),
               name,
               get_mods_name(mods),
               get_action_name(action));
    }
    else
    {
        printf("%08x to %i at %0.3f: Key 0x%04x Scancode 0x%04x (%s) (with%s) was %s\n",
               counter++, slot->number, glfwGetTime(), key, scancode,
               get_key_name(key),
               get_mods_name(mods),
               get_action_name(action));
    }

    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_C:
        {
            slot->closeable = !slot->closeable;

            printf("(( closing %s ))\n", slot->closeable ? "enabled" : "disabled");
            break;
        }

        case GLFW_KEY_L:
        {
            const int state = glfwGetInputMode(window, GLFW_LOCK_KEY_MODS);
            glfwSetInputMode(window, GLFW_LOCK_KEY_MODS, !state);

            printf("(( lock key mods %s ))\n", !state ? "enabled" : "disabled");
            break;
        }
    }
}